

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O1

void Bac_ManWriteConstBit(Bac_Ntk_t *p,int iObj,int fHead)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  Vec_Str_t *pVVar4;
  char cVar5;
  char *pcVar6;
  size_t sVar7;
  int i;
  long lVar8;
  byte bVar9;
  
  if ((iObj < 0) || (iVar2 = (p->vType).nSize, iVar2 <= iObj)) {
LAB_003cc8e0:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
  pcVar6 = (p->vType).pArray;
  bVar1 = pcVar6[(uint)iObj];
  if ((9 < bVar1) || ((0x30cU >> (bVar1 & 0x1f) & 1) == 0)) {
    __assert_fail("Bac_ObjIsCi(p, i)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                  ,0x12e,"int Bac_ObjGetConst(Bac_Ntk_t *, int)");
  }
  pVVar4 = p->pDesign->vOut;
  bVar9 = 0;
  if ((bVar1 & 0xfe) == 8) {
    if ((iObj == 0) || (iVar2 < iObj)) goto LAB_003cc8e0;
    bVar1 = pcVar6[(ulong)(uint)iObj - 1];
    bVar9 = 0;
    if (0xf7 < (byte)(bVar1 - 0x14)) {
      bVar9 = bVar1 >> 1;
    }
  }
  if (bVar9 == 0) {
    __assert_fail("Const",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacWriteVer.c"
                  ,0xe4,"void Bac_ManWriteConstBit(Bac_Ntk_t *, int, int)");
  }
  if (fHead != 0) {
    lVar8 = 0;
    do {
      cVar5 = "1\'b"[lVar8];
      uVar3 = pVVar4->nCap;
      if (pVVar4->nSize == uVar3) {
        if ((int)uVar3 < 0x10) {
          if (pVVar4->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(0x10);
          }
          else {
            pcVar6 = (char *)realloc(pVVar4->pArray,0x10);
          }
          sVar7 = 0x10;
        }
        else {
          sVar7 = (ulong)uVar3 * 2;
          if ((int)sVar7 <= (int)uVar3) goto LAB_003cc687;
          if (pVVar4->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(sVar7);
          }
          else {
            pcVar6 = (char *)realloc(pVVar4->pArray,sVar7);
          }
        }
        pVVar4->pArray = pcVar6;
        pVVar4->nCap = (int)sVar7;
      }
LAB_003cc687:
      iVar2 = pVVar4->nSize;
      pVVar4->nSize = iVar2 + 1;
      pVVar4->pArray[iVar2] = cVar5;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
  }
  switch(bVar9) {
  case 6:
    uVar3 = pVVar4->nCap;
    cVar5 = '0';
    if (pVVar4->nSize != uVar3) goto LAB_003cc87f;
    if ((int)uVar3 < 0x10) {
      if (pVVar4->pArray == (char *)0x0) {
        pcVar6 = (char *)malloc(0x10);
      }
      else {
        pcVar6 = (char *)realloc(pVVar4->pArray,0x10);
      }
      pVVar4->pArray = pcVar6;
      cVar5 = '0';
LAB_003cc877:
      sVar7 = 0x10;
    }
    else {
      sVar7 = (ulong)uVar3 * 2;
      if ((int)sVar7 <= (int)uVar3) goto LAB_003cc87f;
      if (pVVar4->pArray == (char *)0x0) {
        pcVar6 = (char *)malloc(sVar7);
      }
      else {
        pcVar6 = (char *)realloc(pVVar4->pArray,sVar7);
      }
      pVVar4->pArray = pcVar6;
      cVar5 = '0';
    }
    break;
  case 7:
    uVar3 = pVVar4->nCap;
    cVar5 = '1';
    if (pVVar4->nSize != uVar3) goto LAB_003cc87f;
    if ((int)uVar3 < 0x10) {
      if (pVVar4->pArray == (char *)0x0) {
        pcVar6 = (char *)malloc(0x10);
      }
      else {
        pcVar6 = (char *)realloc(pVVar4->pArray,0x10);
      }
      pVVar4->pArray = pcVar6;
      cVar5 = '1';
      goto LAB_003cc877;
    }
    sVar7 = (ulong)uVar3 * 2;
    if ((int)sVar7 <= (int)uVar3) goto LAB_003cc87f;
    if (pVVar4->pArray == (char *)0x0) {
      pcVar6 = (char *)malloc(sVar7);
    }
    else {
      pcVar6 = (char *)realloc(pVVar4->pArray,sVar7);
    }
    pVVar4->pArray = pcVar6;
    cVar5 = '1';
    break;
  case 8:
    uVar3 = pVVar4->nCap;
    cVar5 = 'x';
    if (pVVar4->nSize != uVar3) goto LAB_003cc87f;
    if ((int)uVar3 < 0x10) {
      if (pVVar4->pArray == (char *)0x0) {
        pcVar6 = (char *)malloc(0x10);
      }
      else {
        pcVar6 = (char *)realloc(pVVar4->pArray,0x10);
      }
      pVVar4->pArray = pcVar6;
      cVar5 = 'x';
      goto LAB_003cc877;
    }
    sVar7 = (ulong)uVar3 * 2;
    if ((int)sVar7 <= (int)uVar3) goto LAB_003cc87f;
    if (pVVar4->pArray == (char *)0x0) {
      pcVar6 = (char *)malloc(sVar7);
    }
    else {
      pcVar6 = (char *)realloc(pVVar4->pArray,sVar7);
    }
    pVVar4->pArray = pcVar6;
    cVar5 = 'x';
    break;
  case 9:
    uVar3 = pVVar4->nCap;
    cVar5 = 'z';
    if (pVVar4->nSize != uVar3) goto LAB_003cc87f;
    if ((int)uVar3 < 0x10) {
      if (pVVar4->pArray == (char *)0x0) {
        pcVar6 = (char *)malloc(0x10);
      }
      else {
        pcVar6 = (char *)realloc(pVVar4->pArray,0x10);
      }
      pVVar4->pArray = pcVar6;
      cVar5 = 'z';
      goto LAB_003cc877;
    }
    sVar7 = (ulong)uVar3 * 2;
    if ((int)sVar7 <= (int)uVar3) goto LAB_003cc87f;
    if (pVVar4->pArray == (char *)0x0) {
      pcVar6 = (char *)malloc(sVar7);
    }
    else {
      pcVar6 = (char *)realloc(pVVar4->pArray,sVar7);
    }
    pVVar4->pArray = pcVar6;
    cVar5 = 'z';
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacWriteVer.c"
                  ,0xef,"void Bac_ManWriteConstBit(Bac_Ntk_t *, int, int)");
  }
  pVVar4->nCap = (int)sVar7;
LAB_003cc87f:
  iVar2 = pVVar4->nSize;
  pVVar4->nSize = iVar2 + 1;
  pVVar4->pArray[iVar2] = cVar5;
  return;
}

Assistant:

static inline void Bac_ManWriteConstBit( Bac_Ntk_t * p, int iObj, int fHead )
{
    Vec_Str_t * vStr = p->pDesign->vOut;
    int Const = Bac_ObjGetConst(p, iObj);
    assert( Const );
    if ( fHead )
        Vec_StrPrintStr( vStr, "1\'b" );
    if ( Const == BAC_BOX_CF )
        Vec_StrPush( vStr, '0' );
    else if ( Const == BAC_BOX_CT )
        Vec_StrPush( vStr, '1' );
    else if ( Const == BAC_BOX_CX )
        Vec_StrPush( vStr, 'x' );
    else if ( Const == BAC_BOX_CZ )
        Vec_StrPush( vStr, 'z' );
    else assert( 0 );
}